

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<false>::tryme<2u,14u>(uint32_t *n,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 2;
  if (len < 2) {
    uVar2 = len;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar2 == uVar3) break;
    uVar1 = uVar3 + 1;
  } while (n[uVar3] < 0x4000);
  return uVar2 <= uVar3;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    return true;
  }